

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  long lVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 local_38;
  ImVec2 local_30;
  ImRect local_28;
  ImGuiWindow *local_18;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  window = (ImGuiWindow *)GImGui;
  local_18 = GImGui->CurrentWindow;
  if (((((local_18->Appearing & 1U) != 0) && (GImGui->NavWindow == local_18->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (GImGui->NavWindow->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar2->NavInitResultId = (pIVar2->NavWindow->DC).LastItemId;
    local_30 = operator-(&(pIVar2->NavWindow->DC).LastItemRect.Min,&pIVar2->NavWindow->Pos);
    lVar1 = *(long *)&window[7].DC.FocusCounterAll;
    local_38 = operator-((ImVec2 *)(lVar1 + 0x120),(ImVec2 *)(lVar1 + 0x10));
    ImRect::ImRect(&local_28,&local_30,&local_38);
    window[7].IDStack.Data = (uint *)local_28.Min;
    window[7].OuterRectClipped.Min = local_28.Max;
    NavUpdateAnyRequestFlag();
    bVar3 = IsItemVisible();
    if (!bVar3) {
      SetScrollHereY(0.5);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}